

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

vec4 dja::normalize(vec4 *a)

{
  float fVar1;
  vec4 vVar2;
  
  fVar1 = a->w * a->w + a->z * a->z + a->x * a->x + a->y * a->y;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  vVar2.x = a->x * fVar1;
  vVar2.z = a->z * fVar1;
  vVar2.y = a->y * fVar1;
  vVar2.w = fVar1 * a->w;
  return vVar2;
}

Assistant:

V4 normalize(const V4& a) {return a / norm(a);}